

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O2

void zzRedCrandMont(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  word wVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar8 = 0;
  wVar6 = 0;
  uVar10 = 0;
  for (sVar7 = 0; n != sVar7; sVar7 = sVar7 + 1) {
    uVar9 = a[sVar7] * mont_param;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar9;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = -*mod;
    puVar1 = a + n + sVar7;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar9 + uVar8;
    uVar10 = wVar6 + SUB168(auVar4 * auVar5,8);
    puVar1 = a + sVar7 + 1;
    uVar3 = *puVar1;
    *puVar1 = *puVar1 - uVar10;
    uVar8 = (ulong)(CARRY8(uVar2,uVar9 + uVar8) || CARRY8(uVar9,uVar8));
    wVar6 = (word)(uVar3 < uVar10);
  }
  wVar6 = zzSubW2(a + n + 1,n - 1,wVar6);
  for (sVar7 = 0; n != sVar7; sVar7 = sVar7 + 1) {
    uVar2 = a[n + sVar7];
    a[sVar7] = uVar2;
    uVar10 = (ulong)((uint)uVar10 & (uint)(mod[sVar7] == uVar2)) | (ulong)(mod[sVar7] < uVar2);
  }
  zzSubAndW(a,mod,n,-(uVar10 | uVar8 - wVar6));
  return;
}

Assistant:

void SAFE(zzRedCrandMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word borrow = 0;
	register word w = 0;
	register dword prod;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] % 2  && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		zzMul11(prod, w, WORD_0 - mod[0]);
		w += carry;
		carry = wordLess01(w, carry);
		a[i + n] += w;
		carry |= wordLess01(a[i + n], w); 
		w = (word)(prod >> B_PER_W);
		w += borrow;
		borrow = wordLess01(w, borrow);
		borrow |= wordLess01(a[i + 1], w);
		a[i + 1] -= w;
	}
	// a <- a - borrow * B^{n + 1}
	carry -= zzSubW2(a + n + 1, n - 1, borrow);
	// a <- a / B^n, a >= mod?
	for (i = 0; i < n; ++i)
	{
		a[i] = a[n + i];
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= carry, w = WORD_0 - w;
	zzSubAndW(a, mod, n, w);
	// очистка
	prod = 0;
	carry = borrow = w = 0;
}